

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void sysbvm_jit_x86_mov64IntoMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t offset,
               sysbvm_x86_register_t source)

{
  undefined5 uVar1;
  sysbvm_x86_register_t sVar2;
  undefined8 in_RAX;
  byte bVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  byte bVar7;
  size_t byteCount;
  uint8_t instruction [8];
  undefined8 local_8;
  undefined1 uVar4;
  
  sVar2 = destination & SYSBVM_X86_64_ARG0;
  uVar6 = (undefined1)((uint)offset >> 8);
  bVar3 = (byte)source;
  bVar7 = (byte)destination;
  uVar5 = (undefined1)((uint)offset >> 0x18);
  uVar4 = (undefined1)((uint)offset >> 0x10);
  local_8._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
  uVar1 = local_8._3_5_;
  local_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  if (offset == 0) {
    if (sVar2 != SYSBVM_X86_EBP) {
      if (sVar2 == SYSBVM_X86_ESP) {
        local_8._0_3_ = CONCAT12((bVar7 & 7) + 0x20,0x8948);
        local_8._0_4_ = CONCAT13((bVar3 & 7) << 3 | bVar7 & 7,(uint3)local_8);
        byteCount = 4;
      }
      else {
        local_8._0_3_ = CONCAT12((bVar3 & 7) << 3 | bVar7 & 7,0x8948);
        local_8 = CONCAT53(uVar1,(uint3)local_8);
        byteCount = 3;
      }
      goto LAB_00153d29;
    }
  }
  else if (sVar2 == SYSBVM_X86_ESP) {
    local_8._0_3_ = CONCAT12((bVar3 & 7) << 3,0x8948) | 0x840000;
    local_8._0_4_ = CONCAT13(0x24,(uint3)local_8);
    local_8 = CONCAT17(uVar5,CONCAT16(uVar4,CONCAT15(uVar6,CONCAT14((char)offset,(undefined4)local_8
                                                                   ))));
    byteCount = 8;
    goto LAB_00153d29;
  }
  local_8._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
  local_8 = CONCAT17(local_8._7_1_,
                     CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar6,CONCAT13((char)offset,
                                                                           CONCAT12((bVar3 & 7) << 3
                                                                                    | bVar7 & 7,
                                                                                    0x8948)))))) |
            0x800000;
  byteCount = 7;
LAB_00153d29:
  sysbvm_bytecodeJit_addBytes(jit,byteCount,(uint8_t *)&local_8);
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64IntoMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t offset, sysbvm_x86_register_t source)
{
    if(offset == 0 && (destination & SYSBVM_X86_REG_HALF_MASK) != SYSBVM_X86_RBP)
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_sibOnlyBase(destination),
                sysbvm_jit_x86_modRM(destination, source, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);            
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);            
        }
    }
    else
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 2),
                sysbvm_jit_x86_sibOnlyBase(destination),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}